

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

RequestConnectOrProtocolError * __thiscall
kj::HttpHeaders::tryParseRequestOrConnect
          (RequestConnectOrProtocolError *__return_storage_ptr__,HttpHeaders *this,
          ArrayPtr<char> content)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  char *ptr;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_60;
  char *local_58;
  Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> local_50;
  undefined8 local_38;
  
  uVar3 = content.size_;
  pcVar4 = content.ptr;
  if ((uVar3 < 2) || (pcVar4[uVar3 - 1] != '\n')) {
    __return_storage_ptr__->tag = 3;
    *(undefined4 *)&__return_storage_ptr__->field_1 = 400;
    *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Bad Request";
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0xc;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) =
         "Request headers have no terminal newline.";
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x2a;
  }
  else {
    lVar1 = uVar3 - 1;
    if (pcVar4[uVar3 - 2] == '\r') {
      lVar1 = uVar3 - 2;
    }
    pcVar4[~(ulong)(pcVar4[uVar3 - 2] == '\r') + uVar3] = '\0';
    local_58 = pcVar4;
    consumeHttpMethod(&local_50,&local_58);
    local_60 = local_50.ptr.field_1.value.tag;
    if ((local_50.ptr.isSet == true) && ((*local_58 == ' ' || (*local_58 == '\t')))) {
      local_70 = local_50.ptr.field_1.value.tag;
      local_68 = local_50.ptr.field_1._8_4_;
      local_58 = local_58 + 1;
      consumeWord(&local_58);
      if (local_50.ptr.isSet == true) {
        local_38 = CONCAT44(local_50.ptr.field_1._12_4_,local_50.ptr.field_1._8_4_);
        if (local_60 == 1) {
          local_6c = local_50.ptr.field_1.value.tag;
          local_60 = local_50.ptr.field_1._4_4_;
        }
        else if (local_60 == 2) {
          local_60 = local_50.ptr.field_1._12_4_;
          local_70 = 2;
          local_68 = local_50.ptr.field_1.value.tag;
          local_6c = local_50.ptr.field_1._8_4_;
        }
        else {
          local_70 = 0;
        }
        consumeLine(&local_58);
        bVar2 = parseHeaders(this,local_58,pcVar4 + lVar1);
        if (bVar2) {
          __return_storage_ptr__->tag = local_70;
          if (local_70 == 2) {
            *(uint *)&__return_storage_ptr__->field_1 = local_68;
            *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 4) = local_50.ptr.field_1._4_4_
            ;
            *(uint *)((long)&__return_storage_ptr__->field_1 + 8) = local_6c;
            *(uint *)((long)&__return_storage_ptr__->field_1 + 0xc) = local_60;
            return __return_storage_ptr__;
          }
          if (local_70 != 1) {
            return __return_storage_ptr__;
          }
          *(uint *)&__return_storage_ptr__->field_1 = local_68;
          *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 4) = local_50.ptr.field_1._4_4_;
          *(uint *)((long)&__return_storage_ptr__->field_1 + 8) = local_6c;
          *(uint *)((long)&__return_storage_ptr__->field_1 + 0xc) = local_60;
          *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = local_38;
          return __return_storage_ptr__;
        }
        __return_storage_ptr__->tag = 3;
        *(undefined4 *)&__return_storage_ptr__->field_1 = 400;
        *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Bad Request";
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0xc;
        *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) =
             "The headers sent by your client are not valid.";
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x2f;
      }
      else {
        __return_storage_ptr__->tag = 3;
        *(undefined4 *)&__return_storage_ptr__->field_1 = 400;
        *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Bad Request";
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0xc;
        *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) = "Invalid request line.";
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x16;
      }
    }
    else {
      __return_storage_ptr__->tag = 3;
      *(undefined4 *)&__return_storage_ptr__->field_1 = 0x1f5;
      *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Not Implemented";
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0x10;
      *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) = "Unrecognized request method.";
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x1d;
    }
  }
  *(char **)((long)&__return_storage_ptr__->field_1 + 0x28) = pcVar4;
  *(ulong *)((long)&__return_storage_ptr__->field_1 + 0x30) = uVar3;
  return __return_storage_ptr__;
}

Assistant:

HttpHeaders::RequestConnectOrProtocolError HttpHeaders::tryParseRequestOrConnect(
    kj::ArrayPtr<char> content) {
  char* end = trimHeaderEnding(content);
  if (end == nullptr) {
    return ProtocolError { 400, "Bad Request",
        "Request headers have no terminal newline.", content };
  }

  char* ptr = content.begin();

  HttpHeaders::RequestConnectOrProtocolError result;

  KJ_IF_SOME(method, consumeHttpMethod(ptr)) {
    if (*ptr != ' ' && *ptr != '\t') {
      return ProtocolError { 501, "Not Implemented",
          "Unrecognized request method.", content };
    }
    ++ptr;

    kj::Maybe<StringPtr> path;
    KJ_IF_SOME(p, consumeWord(ptr)) {
      path = p;
    } else {
      return ProtocolError { 400, "Bad Request",
          "Invalid request line.", content };
    }

    KJ_SWITCH_ONEOF(method) {
      KJ_CASE_ONEOF(m, HttpMethod) {
        result = HttpHeaders::Request { m, KJ_ASSERT_NONNULL(path) };
      }
      KJ_CASE_ONEOF(m, HttpConnectMethod) {
        result = HttpHeaders::ConnectRequest { KJ_ASSERT_NONNULL(path) };
      }
    }
  }